

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_mqtt_prepend_header(mg_connection *nc,uint8_t cmd,uint8_t flags,size_t len)

{
  byte *local_40;
  uint8_t *vlen;
  uint8_t buf [9];
  uint8_t header;
  size_t off;
  size_t len_local;
  uint8_t flags_local;
  uint8_t cmd_local;
  mg_connection *nc_local;
  
  register0x00000000 = (nc->send_mbuf).len - len;
  vlen._6_1_ = cmd << 4 | flags;
  local_40 = (byte *)((long)&vlen + 7);
  buf[1] = vlen._6_1_;
  off = len;
  if ((nc->send_mbuf).len < len) {
    __assert_fail("nc->send_mbuf.len >= len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0x1cdc,
                  "void mg_mqtt_prepend_header(struct mg_connection *, uint8_t, uint8_t, size_t)");
  }
  do {
    *local_40 = (byte)off & 0x7f;
    off = off >> 7;
    if (off != 0) {
      *local_40 = *local_40 | 0x80;
    }
    local_40 = local_40 + 1;
  } while (off != 0);
  mbuf_insert(&nc->send_mbuf,stack0xffffffffffffffd8,(void *)((long)&vlen + 6),
              (long)local_40 - ((long)&vlen + 6));
  return;
}

Assistant:

static void mg_mqtt_prepend_header(struct mg_connection *nc, uint8_t cmd,
                                   uint8_t flags, size_t len) {
    size_t off = nc->send_mbuf.len - len;
    uint8_t header = cmd << 4 | (uint8_t) flags;

    uint8_t buf[1 + sizeof(size_t)];
    uint8_t *vlen = &buf[1];

    assert(nc->send_mbuf.len >= len);

    buf[0] = header;

    /* mqtt variable length encoding */
    do {
        *vlen = len % 0x80;
        len /= 0x80;
        if (len > 0) *vlen |= 0x80;
        vlen++;
    } while (len > 0);

    mbuf_insert(&nc->send_mbuf, off, buf, vlen - buf);
}